

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_server_main.cpp
# Opt level: O2

void main_posix(settings *par)

{
  int iVar1;
  char cVar2;
  undefined8 uVar3;
  ostream *poVar4;
  intrusive_ptr<cppcms::impl::base_cache> local_130;
  tcp_cache_service srv;
  __shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2> local_120;
  int sig;
  string local_108 [32];
  message local_e8 [48];
  daemonizer demon;
  sigset_t wait_mask;
  
  cppcms::impl::daemonizer::daemonizer(&demon,&par->config);
  local_130.p_ = (par->cache).p_;
  if (local_130.p_ != (base_cache *)0x0) {
    (**(code **)(*(long *)local_130.p_ + 0x30))();
  }
  std::__shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_120,
               &(par->sessions).
                super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
              );
  iVar1 = par->threads;
  std::__cxx11::string::string(local_108,(string *)par);
  cppcms::impl::tcp_cache_service::tcp_cache_service
            (&srv,&local_130,&local_120,iVar1,local_108,par->port,par->gc);
  std::__cxx11::string::~string(local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_130);
  sigemptyset((sigset_t *)&wait_mask);
  sigaddset((sigset_t *)&wait_mask,2);
  sigaddset((sigset_t *)&wait_mask,3);
  sigaddset((sigset_t *)&wait_mask,0xf);
  pthread_sigmask(0,(sigset_t *)&wait_mask,(__sigset_t *)0x0);
  sig = 0;
  sigwait((sigset_t *)&wait_mask,&sig);
  uVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(uVar3,0x32,"cppcms_scale");
  if (cVar2 != '\0') {
    booster::log::message::message
              (local_e8,0x32,"cppcms_scale",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/cache_server_main.cpp"
               ,0xca);
    poVar4 = (ostream *)booster::log::message::out();
    std::operator<<(poVar4,"Catch signal: exiting...");
    booster::log::message::~message(local_e8);
  }
  cppcms::impl::tcp_cache_service::stop();
  cppcms::impl::tcp_cache_service::~tcp_cache_service(&srv);
  cppcms::impl::daemonizer::~daemonizer(&demon);
  return;
}

Assistant:

void main_posix(settings &par)
{
	cppcms::impl::daemonizer demon(par.config);

	cppcms::impl::tcp_cache_service srv(
		par.cache,
		par.sessions,
		par.threads,
		par.ip,
		par.port,
		par.gc);
	
	// Wait for signals for exit
	sigset_t wait_mask;
	sigemptyset(&wait_mask);
	sigaddset(&wait_mask, SIGINT);
	sigaddset(&wait_mask, SIGQUIT);
	sigaddset(&wait_mask, SIGTERM);
	pthread_sigmask(SIG_BLOCK, &wait_mask, 0);
	int sig = 0;
	sigwait(&wait_mask, &sig);
	
	BOOSTER_NOTICE("cppcms_scale")<<"Catch signal: exiting...";

	srv.stop();
}